

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError ValidateOpenStreamParameters
                  (PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *streamCallback,PaUtilHostApiRepresentation **hostApi,
                  PaDeviceIndex *hostApiInputDevice,PaDeviceIndex *hostApiOutputDevice)

{
  PaUtilHostApiRepresentation *pPVar1;
  uint uVar2;
  uint uVar3;
  PaError PVar4;
  int iVar5;
  
  if (inputParameters == (PaStreamParameters *)0x0 && outputParameters == (PaStreamParameters *)0x0)
  {
    return -0x270c;
  }
  if (inputParameters == (PaStreamParameters *)0x0) {
    *hostApiInputDevice = -1;
    uVar2 = 0xffffffff;
  }
  else {
    iVar5 = inputParameters->device;
    if (iVar5 == -2) {
      if (inputParameters->hostApiSpecificStreamInfo == (void *)0x0) {
        return -0x270c;
      }
      uVar2 = Pa_HostApiTypeIdToHostApiIndex
                        (*(PaHostApiTypeId *)((long)inputParameters->hostApiSpecificStreamInfo + 8))
      ;
      if (uVar2 == 0xffffffff) {
        return -0x270c;
      }
      *hostApiInputDevice = -2;
      *hostApi = hostApis_[(int)uVar2];
    }
    else {
      if (iVar5 < 0) {
        return -0x270c;
      }
      if (deviceCount_ <= iVar5) {
        return -0x270c;
      }
      uVar2 = FindHostApi(iVar5,hostApiInputDevice);
      if ((int)uVar2 < 0) {
        return -0x2702;
      }
      pPVar1 = hostApis_[uVar2];
      *hostApi = pPVar1;
      if (inputParameters->channelCount < 1) {
        return -0x270e;
      }
      iVar5 = SampleFormatIsValid(inputParameters->sampleFormat);
      if (iVar5 == 0) {
        return -0x270a;
      }
      if ((inputParameters->hostApiSpecificStreamInfo != (void *)0x0) &&
         (*(PaHostApiTypeId *)((long)inputParameters->hostApiSpecificStreamInfo + 8) !=
          (pPVar1->info).type)) {
        return -0x2700;
      }
    }
  }
  if (outputParameters == (PaStreamParameters *)0x0) {
    *hostApiOutputDevice = -1;
  }
  else {
    iVar5 = outputParameters->device;
    if (iVar5 == -2) {
      if (outputParameters->hostApiSpecificStreamInfo == (void *)0x0) {
        return -0x270c;
      }
      uVar3 = Pa_HostApiTypeIdToHostApiIndex
                        (*(PaHostApiTypeId *)((long)outputParameters->hostApiSpecificStreamInfo + 8)
                        );
      if (uVar3 == 0xffffffff) {
        return -0x270c;
      }
      *hostApiOutputDevice = -2;
      *hostApi = hostApis_[(int)uVar3];
    }
    else {
      if (iVar5 < 0) {
        return -0x270c;
      }
      if (deviceCount_ <= iVar5) {
        return -0x270c;
      }
      uVar3 = FindHostApi(iVar5,hostApiOutputDevice);
      if ((int)uVar3 < 0) {
        return -0x2702;
      }
      pPVar1 = hostApis_[uVar3];
      *hostApi = pPVar1;
      if (outputParameters->channelCount < 1) {
        return -0x270e;
      }
      iVar5 = SampleFormatIsValid(outputParameters->sampleFormat);
      if (iVar5 == 0) {
        return -0x270a;
      }
      if ((outputParameters->hostApiSpecificStreamInfo != (void *)0x0) &&
         (*(PaHostApiTypeId *)((long)outputParameters->hostApiSpecificStreamInfo + 8) !=
          (pPVar1->info).type)) {
        return -0x2700;
      }
    }
    if ((uVar2 != uVar3 && outputParameters != (PaStreamParameters *)0x0) &&
        inputParameters != (PaStreamParameters *)0x0) {
      return -0x2709;
    }
  }
  PVar4 = -0x270d;
  if ((((1000.0 <= sampleRate) && (sampleRate <= 384000.0)) &&
      (PVar4 = -0x270b, (streamFlags & 0xffffffff0000fff0) == 0)) &&
     (((streamFlags & 4) == 0 ||
      (((inputParameters != (PaStreamParameters *)0x0 &&
        (outputParameters != (PaStreamParameters *)0x0)) &&
       ((framesPerBuffer == 0 && (streamCallback != (PaStreamCallback *)0x0)))))))) {
    PVar4 = 0;
  }
  return PVar4;
}

Assistant:

static PaError ValidateOpenStreamParameters(
    const PaStreamParameters *inputParameters,
    const PaStreamParameters *outputParameters,
    double sampleRate,
    unsigned long framesPerBuffer,
    PaStreamFlags streamFlags,
    PaStreamCallback *streamCallback,
    PaUtilHostApiRepresentation **hostApi,
    PaDeviceIndex *hostApiInputDevice,
    PaDeviceIndex *hostApiOutputDevice )
{
    int inputHostApiIndex  = -1;    /* Suppress uninitialised var warnings: compiler does */
    int outputHostApiIndex = -1;    /* not see that if inputParameters and outputParameters  */
                                    /* are both nonzero, these indices are set. */

    if( (inputParameters == NULL) && (outputParameters == NULL) )
    {
        return paInvalidDevice; /** @todo should be a new error code "invalid device parameters" or something */
    }
    else
    {
        if( inputParameters == NULL )
        {
            *hostApiInputDevice = paNoDevice;
        }
        else if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
        {
            if( inputParameters->hostApiSpecificStreamInfo )
            {
                inputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( inputHostApiIndex != -1 )
                {
                    *hostApiInputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[inputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( inputParameters->device < 0 || inputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            inputHostApiIndex = FindHostApi( inputParameters->device, hostApiInputDevice );
            if( inputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[inputHostApiIndex];

            if( inputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( inputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( inputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( outputParameters == NULL )
        {
            *hostApiOutputDevice = paNoDevice;
        }
        else if( outputParameters->device == paUseHostApiSpecificDeviceSpecification  )
        {
            if( outputParameters->hostApiSpecificStreamInfo )
            {
                outputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( outputHostApiIndex != -1 )
                {
                    *hostApiOutputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[outputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( outputParameters->device < 0 || outputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            outputHostApiIndex = FindHostApi( outputParameters->device, hostApiOutputDevice );
            if( outputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[outputHostApiIndex];

            if( outputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( outputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( outputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( (inputParameters != NULL) && (outputParameters != NULL) )
        {
            /* ensure that both devices use the same API */
            if( inputHostApiIndex != outputHostApiIndex )
                return paBadIODeviceCombination;
        }
    }


    /* Check for absurd sample rates. */
    if( (sampleRate < 1000.0) || (sampleRate > 384000.0) )
        return paInvalidSampleRate;

    if( ((streamFlags & ~paPlatformSpecificFlags) & ~(paClipOff | paDitherOff | paNeverDropInput | paPrimeOutputBuffersUsingStreamCallback ) ) != 0 )
        return paInvalidFlag;

    if( streamFlags & paNeverDropInput )
    {
        /* must be a callback stream */
        if( !streamCallback )
            return paInvalidFlag;

        /* must be a full duplex stream */
        if( (inputParameters == NULL) || (outputParameters == NULL) )
            return paInvalidFlag;

        /* must use paFramesPerBufferUnspecified */
        if( framesPerBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    return paNoError;
}